

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  ggwave_ProtocolId gVar3;
  size_type sVar4;
  long lVar5;
  char *pcVar6;
  undefined8 *in_RSI;
  uint in_EDI;
  float sampleRate;
  float freq_hz;
  char *tone;
  char *__end1;
  char *__begin1;
  Tones *__range1;
  int duration_ms;
  Tones tones;
  Protocol *protocol;
  string message;
  int fd;
  Protocol *protocol_1;
  int i;
  GGWave ggWave;
  OperatingMode mode;
  int payloadLength;
  int txProtocolId;
  bool useDSS;
  bool useBeep;
  bool printArduino;
  bool printTones;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  TxProtocols *protocols;
  undefined4 in_stack_fffffffffffff568;
  undefined4 in_stack_fffffffffffff56c;
  string *in_stack_fffffffffffff570;
  key_type *in_stack_fffffffffffff578;
  char *pcVar7;
  undefined4 in_stack_fffffffffffff580;
  undefined4 in_stack_fffffffffffff584;
  key_type *in_stack_fffffffffffff588;
  Protocol *this;
  undefined4 in_stack_fffffffffffff590;
  undefined4 in_stack_fffffffffffff594;
  int fd_00;
  uint local_a04;
  uint local_9d4;
  char *local_950;
  undefined1 local_928 [12];
  Protocol *local_918;
  string local_910 [32];
  int local_8f0;
  undefined4 local_8ec;
  Protocol *local_8e8;
  uint local_8e0;
  uint local_8dc [9];
  GGWave local_8b8 [1464];
  undefined4 local_300;
  byte local_2fb;
  byte local_2fa;
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  uint local_2b0;
  byte local_2ab;
  byte local_2aa;
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [32];
  uint local_260;
  allocator local_259;
  string local_258 [38];
  byte local_232;
  allocator local_231;
  string local_230 [38];
  byte local_20a;
  allocator local_209;
  string local_208 [35];
  byte local_1e5;
  allocator local_1d1;
  string local_1d0 [39];
  byte local_1a9;
  undefined1 local_1a8 [48];
  undefined1 local_178 [352];
  Protocols *local_18;
  uint local_8;
  int local_4;
  
  local_4 = 0;
  local_8 = in_EDI;
  printf("Usage: %s [-p] [-b] [-tN] [-lN]\n",*in_RSI);
  printf("    -p  - print tones, no playback\n");
  printf("    -A  - print Arduino code\n");
  printf("    -b  - use \'beep\' command\n");
  printf("    -s  - use Direct Sequence Spread (DSS)\n");
  printf("    -tN - transmission protocol\n");
  printf("    -lN - fixed payload length of size N, N in [1, %d]\n",0x40);
  printf("\n");
  local_18 = (Protocols *)GGWave::Protocols::tx();
  memset(local_178,0,0x160);
  memcpy(local_178,&PTR_anon_var_dwarf_1698_00109c18,0x160);
  memcpy(local_18,local_178,0x160);
  parseCmdArguments_abi_cxx11_((int)local_1a8,(char **)(ulong)local_8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"p",&local_1d1);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff584,in_stack_fffffffffffff580),
                  in_stack_fffffffffffff578);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  local_1a9 = sVar4 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"A",&local_209);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff584,in_stack_fffffffffffff580),
                  in_stack_fffffffffffff578);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  local_1e5 = sVar4 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"b",&local_231);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff584,in_stack_fffffffffffff580),
                  in_stack_fffffffffffff578);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  local_20a = sVar4 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"s",&local_259);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff584,in_stack_fffffffffffff580),
                  in_stack_fffffffffffff578);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  local_232 = sVar4 != 0;
  std::allocator<char>::allocator();
  local_2aa = 0;
  local_2ab = 0;
  std::__cxx11::string::string(local_280,"t",&local_281);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff584,in_stack_fffffffffffff580),
                  in_stack_fffffffffffff578);
  if (sVar4 == 0) {
    local_9d4 = 0;
  }
  else {
    std::allocator<char>::allocator();
    local_2aa = 1;
    std::__cxx11::string::string(local_2a8,"t",&local_2a9);
    local_2ab = 1;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),in_stack_fffffffffffff588)
    ;
    local_9d4 = std::__cxx11::stoi(in_stack_fffffffffffff570,
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),0);
  }
  if ((local_2ab & 1) != 0) {
    std::__cxx11::string::~string(local_2a8);
  }
  if ((local_2aa & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  }
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  local_260 = local_9d4;
  std::allocator<char>::allocator();
  local_2fa = 0;
  local_2fb = 0;
  std::__cxx11::string::string(local_2d0,"l",&local_2d1);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff584,in_stack_fffffffffffff580),
                  in_stack_fffffffffffff578);
  if (sVar4 == 0) {
    local_a04 = 0x10;
  }
  else {
    std::allocator<char>::allocator();
    local_2fa = 1;
    std::__cxx11::string::string(local_2f8,"l",&local_2f9);
    local_2fb = 1;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),in_stack_fffffffffffff588)
    ;
    local_a04 = std::__cxx11::stoi(in_stack_fffffffffffff570,
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),0);
  }
  if ((local_2fb & 1) != 0) {
    std::__cxx11::string::~string(local_2f8);
  }
  if ((local_2fa & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  }
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  local_2b0 = local_a04;
  local_300 = 0xc;
  if ((local_232 & 1) != 0) {
    local_300 = 0x1c;
  }
  local_8dc[0] = local_a04;
  local_8dc[1] = 0x473b8000;
  local_8dc[2] = 0x473b8000;
  local_8dc[3] = 0x473b8000;
  local_8dc[4] = 0x400;
  local_8dc[5] = 0x40400000;
  local_8dc[6] = 5;
  local_8dc[7] = 5;
  local_8dc[8] = local_300;
  GGWave::GGWave(local_8b8,(ggwave_Parameters *)local_8dc);
  printf("Available Tx protocols:\n");
  for (local_8e0 = 0; uVar2 = local_8e0, iVar1 = GGWave::Protocols::size(local_18),
      (int)uVar2 < iVar1; local_8e0 = local_8e0 + 1) {
    local_8e8 = GGWave::Protocols::operator[](local_18,local_8e0);
    if (((local_8e8->enabled & 1U) != 0) && (local_8e8->name != (char *)0x0)) {
      printf("    -t%-2d : %-16s\n",(ulong)local_8e0,local_8e8->name);
    }
  }
  printf("\n");
  uVar2 = local_260;
  if (((int)local_260 < 0) || (iVar1 = GGWave::Protocols::size(local_18), iVar1 <= (int)uVar2)) {
    fprintf(_stderr,"Unknown Tx protocol %d\n",(ulong)local_260);
    local_4 = -3;
    local_8ec = 1;
  }
  else {
    printf("Selecting Tx protocol %d\n",(ulong)local_260);
    local_8f0 = 1;
    if (((local_20a & 1) == 0) && (((local_1a9 & 1) == 0 && ((local_1e5 & 1) == 0)))) {
      iVar1 = ioctl(1,0x4b30,0);
      if (iVar1 != 0) {
        local_8f0 = open("/dev/tty0",0);
      }
      if (local_8f0 < 0) {
        perror("/dev/tty0");
        fprintf(_stderr,"This program must be run as root\n");
        local_4 = 1;
        local_8ec = 1;
        goto LAB_00105476;
      }
    }
    fprintf(_stderr,"Enter a text message:\n");
    std::__cxx11::string::string(local_910);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_910);
    printf("\n");
    lVar5 = std::__cxx11::string::size();
    if (lVar5 == 0) {
      fprintf(_stderr,"Invalid message: size = 0\n");
      local_4 = -2;
    }
    else {
      iVar1 = std::__cxx11::string::size();
      if ((int)local_2b0 < iVar1) {
        fprintf(_stderr,"Invalid message: size > %d\n",(ulong)local_2b0);
        local_4 = -3;
      }
      else {
        uVar2 = std::__cxx11::string::size();
        gVar3 = std::__cxx11::string::data();
        GGWave::init((int)local_8b8,(char *)(ulong)uVar2,gVar3,local_260);
        GGWave::encode();
        local_918 = GGWave::Protocols::operator[](local_18,local_260);
        local_928 = GGWave::txTones();
        fd_00 = local_928._8_4_;
        this = local_918;
        iVar1 = GGWave::samplesPerFrame();
        sampleRate = (float)GGWave::sampleRateOut();
        iVar1 = GGWave::Protocol::txDuration_ms(this,iVar1,sampleRate);
        local_950 = ggvector<signed_char>::begin((ggvector<signed_char> *)local_928);
        pcVar7 = local_950;
        pcVar6 = ggvector<signed_char>::end((ggvector<signed_char> *)local_928);
        for (; local_950 != pcVar6; local_950 = local_950 + 1) {
          GGWave::hzPerSample();
          processTone(fd_00,(double)this,CONCAT44(sampleRate,iVar1),SUB81((ulong)pcVar7 >> 0x38,0),
                      SUB81((ulong)pcVar7 >> 0x30,0),SUB81((ulong)pcVar7 >> 0x28,0));
        }
        local_4 = 0;
      }
    }
    local_8ec = 1;
    std::__cxx11::string::~string(local_910);
  }
LAB_00105476:
  GGWave::~GGWave(local_8b8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x105490);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
    printf("Usage: %s [-p] [-b] [-tN] [-lN]\n", argv[0]);
    printf("    -p  - print tones, no playback\n");
    printf("    -A  - print Arduino code\n");
    printf("    -b  - use 'beep' command\n");
    printf("    -s  - use Direct Sequence Spread (DSS)\n");
    printf("    -tN - transmission protocol\n");
    printf("    -lN - fixed payload length of size N, N in [1, %d]\n", GGWave::kMaxLengthFixed);
    printf("\n");

    auto & protocols = GGWave::Protocols::tx();
    protocols = { {
        { "[R2T2] Normal",      64,  9, 1, 2, true, },
        { "[R2T2] Fast",        64,  6, 1, 2, true, },
        { "[R2T2] Fastest",     64,  3, 1, 2, true, },
        { "[R2T2] Low Normal",  16,  9, 1, 2, true, },
        { "[R2T2] Low Fast",    16,  6, 1, 2, true, },
        { "[R2T2] Low Fastest", 16,  3, 1, 2, true, },
    } };

    const auto argm         = parseCmdArguments(argc, argv);
    const bool printTones   = argm.count("p") > 0;
    const bool printArduino = argm.count("A") > 0;
    const bool useBeep      = argm.count("b") > 0;
    const bool useDSS       = argm.count("s") > 0;
    const int txProtocolId  = argm.count("t") == 0 ? 0 : std::stoi(argm.at("t"));
    const int payloadLength = argm.count("l") == 0 ? 16 : std::stoi(argm.at("l"));

    GGWave::OperatingMode mode = GGWAVE_OPERATING_MODE_TX | GGWAVE_OPERATING_MODE_TX_ONLY_TONES;
    if (useDSS) mode |= GGWAVE_OPERATING_MODE_USE_DSS;

    GGWave ggWave({
        payloadLength,
        GGWave::kDefaultSampleRate,
        GGWave::kDefaultSampleRate,
        GGWave::kDefaultSampleRate,
        GGWave::kDefaultSamplesPerFrame,
        GGWave::kDefaultSoundMarkerThreshold,
        GGWAVE_SAMPLE_FORMAT_F32,
        GGWAVE_SAMPLE_FORMAT_F32,
        mode,
    });

    printf("Available Tx protocols:\n");
    for (int i = 0; i < (int) protocols.size(); ++i) {
        const auto & protocol = protocols[i];
        if (protocol.enabled && protocol.name) {
            printf("    -t%-2d : %-16s\n", i, protocol.name);
        }
    }
    printf("\n");

    if (txProtocolId < 0 || txProtocolId >= (int) protocols.size()) {
        fprintf(stderr, "Unknown Tx protocol %d\n", txProtocolId);
        return -3;
    }

    printf("Selecting Tx protocol %d\n", txProtocolId);

    int fd = 1;
    if (useBeep == false && printTones == false && printArduino == false) {
        if (ioctl(fd, KDMKTONE, 0)) {
            fd = open(CONSOLE, O_RDONLY);
        }
        if (fd < 0) {
            perror(CONSOLE);
            fprintf(stderr, "This program must be run as root\n");
            return 1;
        }
    }

    fprintf(stderr, "Enter a text message:\n");

    std::string message;
    std::getline(std::cin, message);

    printf("\n");

    if (message.size() == 0) {
        fprintf(stderr, "Invalid message: size = 0\n");
        return -2;
    }

    if ((int) message.size() > payloadLength) {
        fprintf(stderr, "Invalid message: size > %d\n", payloadLength);
        return -3;
    }

    ggWave.init(message.size(), message.data(), GGWave::TxProtocolId(txProtocolId), 10);
    ggWave.encode();

    const auto & protocol = protocols[txProtocolId];
    const auto tones = ggWave.txTones();
    const auto duration_ms = protocol.txDuration_ms(ggWave.samplesPerFrame(), ggWave.sampleRateOut());
    for (auto & tone : tones) {
        const auto freq_hz = (protocol.freqStart + tone)*ggWave.hzPerSample();
        processTone(fd, freq_hz, duration_ms, useBeep, printTones, printArduino);
    }

    return 0;
}